

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

string * vera::toUpper(string *__return_storage_ptr__,string *_string)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + _string->_M_string_length);
  cVar2 = *(_string->_M_dataplus)._M_p;
  if (cVar2 != '\0') {
    lVar4 = 0;
    do {
      iVar3 = toupper((int)cVar2);
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar4] = (char)iVar3;
      cVar2 = (_string->_M_dataplus)._M_p[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (cVar2 != '\0');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& _string) {
    std::string std = _string;
    for (int i = 0; _string[i]; i++) {
        std[i] = toupper(_string[i]);
    }
    return std;
}